

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

double ImGui::ScaleValueFromRatioT<double,double,double>
                 (ImGuiDataType data_type,float t,double v_min,double v_max,bool is_logarithmic,
                 float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  bool bVar1;
  byte in_SIL;
  int in_EDI;
  float in_XMM0_Da;
  float fVar2;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  float in_XMM3_Da;
  float in_XMM4_Da;
  double v_new_off_f;
  bool is_floating_point;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  bool flipped;
  double v_max_fudged;
  double v_min_fudged;
  double result;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  double in_stack_ffffffffffffff50;
  float local_8c;
  double local_88;
  float local_7c;
  double local_78;
  float local_6c;
  double local_48;
  double local_40;
  double local_38;
  float local_2c;
  float local_28;
  byte local_21;
  double local_20;
  double local_18;
  float local_10;
  double local_8;
  
  local_21 = in_SIL & 1;
  local_8 = in_XMM1_Qa;
  if (0.0 < in_XMM0_Da) {
    if (((in_XMM1_Qa != in_XMM2_Qa) || (NAN(in_XMM1_Qa) || NAN(in_XMM2_Qa))) &&
       (local_8 = in_XMM2_Qa, in_XMM0_Da < 1.0)) {
      local_38 = 0.0;
      if (local_21 == 0) {
        if (in_EDI == 8 || in_EDI == 9) {
          local_38 = ImLerp<double>(in_XMM1_Qa,in_XMM2_Qa,in_XMM0_Da);
        }
        else if (in_XMM0_Da < 1.0) {
          local_38 = in_XMM1_Qa +
                     (in_XMM2_Qa - in_XMM1_Qa) * (double)in_XMM0_Da +
                     (double)(~-(ulong)(in_XMM2_Qa < in_XMM1_Qa) & 0x3fe0000000000000 |
                             (ulong)((uint)(-(ulong)(in_XMM2_Qa < in_XMM1_Qa) >> 0x20) & 0xbfe00000)
                             << 0x20);
        }
      }
      else {
        local_2c = in_XMM4_Da;
        local_28 = in_XMM3_Da;
        local_20 = in_XMM2_Qa;
        local_18 = in_XMM1_Qa;
        local_10 = in_XMM0_Da;
        dVar3 = ImAbs(in_XMM1_Qa);
        if ((double)local_28 <= dVar3) {
          local_78 = local_18;
        }
        else {
          if (0.0 <= local_18) {
            local_6c = local_28;
          }
          else {
            local_6c = -local_28;
          }
          local_78 = (double)local_6c;
        }
        local_40 = local_78;
        dVar3 = ImAbs(local_20);
        if ((double)local_28 <= dVar3) {
          local_88 = local_20;
        }
        else {
          if (0.0 <= local_20) {
            local_7c = local_28;
          }
          else {
            local_7c = -local_28;
          }
          local_88 = (double)local_7c;
        }
        local_48 = local_88;
        bVar1 = local_20 < local_18;
        if (bVar1) {
          ImSwap<double>(&local_40,&local_48);
        }
        if (((local_20 == 0.0) && (!NAN(local_20))) && (local_18 < 0.0)) {
          local_48 = (double)-local_28;
        }
        if (bVar1) {
          local_8c = 1.0 - local_10;
        }
        else {
          local_8c = local_10;
        }
        if (0.0 <= local_18 * local_20) {
          if ((local_18 < 0.0) || (local_20 < 0.0)) {
            dVar3 = -local_48;
            dVar4 = ImPow(in_stack_ffffffffffffff50,
                          (double)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
            local_38 = -(dVar3 * dVar4);
          }
          else {
            local_38 = ImPow(local_40,(double)CONCAT17(in_stack_ffffffffffffff4f,
                                                       in_stack_ffffffffffffff48));
            local_38 = local_40 * local_38;
          }
        }
        else {
          dVar3 = ImMin<double>(local_18,local_20);
          fVar2 = ImAbs((float)local_20 - (float)local_18);
          fVar2 = -(float)dVar3 / fVar2;
          if ((local_8c < fVar2 - local_2c) || (fVar2 + local_2c < local_8c)) {
            if (fVar2 <= local_8c) {
              local_38 = ImPow(in_stack_ffffffffffffff50,
                               (double)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
                              );
              local_38 = (double)local_28 * local_38;
            }
            else {
              dVar3 = ImPow(in_stack_ffffffffffffff50,
                            (double)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
              local_38 = -((double)local_28 * dVar3);
            }
          }
          else {
            local_38 = 0.0;
          }
        }
      }
      local_8 = local_38;
    }
  }
  return local_8;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    // We special-case the extents because otherwise our logarithmic fudging can lead to "mathematically correct"
    // but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value. Also generally simpler.
    if (t <= 0.0f || v_min == v_max)
        return v_min;
    if (t >= 1.0f)
        return v_max;

    TYPE result = (TYPE)0;
    if (is_logarithmic)
    {
        // Fudge min/max to avoid getting silly results close to zero
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        const bool flipped = v_max < v_min; // Check if range is "backwards"
        if (flipped)
            ImSwap(v_min_fudged, v_max_fudged);

        // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

        if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
        {
            float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
            else if (t_with_flip < zero_point_center)
                result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
            else
                result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
        else
            result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
    }
    else
    {
        // Linear slider
        const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else if (t < 1.0)
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
            result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
        }
    }

    return result;
}